

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  byte bVar1;
  Descriptor *pDVar2;
  undefined8 *puVar3;
  pointer pcVar4;
  size_type sVar5;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  anon_union_216_1_493b367e_for_DescriptorProto_4 *paVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int iVar9;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>_>
  *proto_00;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>_>
  *pVVar10;
  FieldDescriptor *pFVar11;
  FieldDescriptor *pFVar12;
  string *psVar13;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>_>
  *pVVar14;
  OneofDescriptor *pOVar15;
  undefined8 extraout_RAX;
  int index;
  int iVar16;
  long lVar17;
  long lVar18;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view element_name_02;
  OneofDescriptor *oneof_decl;
  Descriptor *local_128;
  int local_11c;
  DescriptorProto *local_118;
  undefined1 local_110 [32];
  OneofDescriptor *local_f0;
  VoidPtr local_e8;
  code *pcStack_e0;
  Descriptor **local_d8;
  int *local_d0;
  OneofDescriptor **local_c8;
  AlphaNum local_c0;
  size_type local_90;
  pointer local_88;
  AlphaNum local_60;
  
  local_128 = message;
  local_118 = proto;
  if (0 < message->nested_type_count_) {
    lVar17 = 0;
    lVar18 = 0;
    do {
      pDVar2 = local_128->nested_types_;
      proto_00 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::DescriptorProto>>
                           (&(proto->field_0)._impl_.nested_type_.super_RepeatedPtrFieldBase,
                            (int)lVar18);
      CrossLinkMessage(this,(Descriptor *)(&pDVar2->super_SymbolBase + lVar17),proto_00);
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x98;
    } while (lVar18 < local_128->nested_type_count_);
  }
  if (0 < local_128->field_count_) {
    paVar6 = &local_118->field_0;
    lVar17 = 0;
    lVar18 = 0;
    do {
      pFVar11 = local_128->fields_;
      pVVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&(paVar6->_impl_).field_.super_RepeatedPtrFieldBase,(int)lVar18);
      CrossLinkField(this,(FieldDescriptor *)(&pFVar11->super_SymbolBase + lVar17),pVVar10);
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x58;
    } while (lVar18 < local_128->field_count_);
  }
  if (0 < local_128->extension_count_) {
    paVar6 = &local_118->field_0;
    lVar17 = 0;
    lVar18 = 0;
    do {
      pFVar11 = local_128->extensions_;
      pVVar10 = internal::RepeatedPtrFieldBase::
                Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                          (&(paVar6->_impl_).extension_.super_RepeatedPtrFieldBase,(int)lVar18);
      CrossLinkField(this,(FieldDescriptor *)(&pFVar11->super_SymbolBase + lVar17),pVVar10);
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x58;
    } while (lVar18 < local_128->extension_count_);
  }
  local_11c = 0;
  if (0 < local_128->field_count_) {
    paVar6 = &local_118->field_0;
    do {
      pFVar11 = Descriptor::field(local_128,local_11c);
      if ((pFVar11->field_0x1 & 0x10) == 0) {
        pOVar15 = (OneofDescriptor *)0x0;
      }
      else {
        pOVar15 = (pFVar11->scope_).containing_oneof;
        if (pOVar15 == (OneofDescriptor *)0x0) goto LAB_001f3f9a;
      }
      local_f0 = pOVar15;
      if (pOVar15 != (OneofDescriptor *)0x0) {
        if (0 < pOVar15->field_count_) {
          pFVar11 = Descriptor::field(local_128,local_11c + -1);
          if ((pFVar11->field_0x1 & 0x10) == 0) {
            pOVar15 = (OneofDescriptor *)0x0;
          }
          else {
            pOVar15 = (pFVar11->scope_).containing_oneof;
            if (pOVar15 == (OneofDescriptor *)0x0) goto LAB_001f3f9a;
          }
          if (pOVar15 != local_f0) {
            local_c0.piece_._M_str = local_128->all_names_[1]._M_dataplus._M_p;
            local_c0.piece_._M_len = local_128->all_names_[1]._M_string_length;
            local_60.piece_._M_len = 1;
            local_60.piece_._M_str = ".";
            pFVar11 = Descriptor::field(local_128,local_11c + -1);
            local_88 = (pFVar11->all_names_->_M_dataplus)._M_p;
            local_90 = pFVar11->all_names_->_M_string_length;
            absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_110,&local_c0,&local_60);
            uVar8 = local_110._8_8_;
            uVar7 = local_110._0_8_;
            pVVar10 = internal::RepeatedPtrFieldBase::
                      Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                                (&(paVar6->_impl_).field_.super_RepeatedPtrFieldBase,local_11c + -1)
            ;
            local_d8 = &local_128;
            local_d0 = &local_11c;
            local_c8 = &local_f0;
            pcStack_e0 = absl::lts_20240722::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
            ;
            make_error.invoker_ =
                 absl::lts_20240722::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkMessage(google::protobuf::Descriptor*,google::protobuf::DescriptorProto_const&)::__0,std::__cxx11::string>
            ;
            make_error.ptr_.obj = &local_d8;
            element_name._M_str = (char *)uVar7;
            element_name._M_len = uVar8;
            local_e8.obj = &local_d8;
            AddError(this,element_name,&pVVar10->super_Message,TYPE,make_error);
            if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
              operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
            }
          }
        }
        pOVar15 = local_128->oneof_decls_;
        iVar9 = (int)((ulong)((long)local_f0 - (long)local_f0->containing_type_->oneof_decls_) >> 3)
                * -0x49249249;
        if (pOVar15[iVar9].field_count_ == 0) {
          pFVar11 = Descriptor::field(local_128,local_11c);
          pOVar15[iVar9].fields_ = pFVar11;
        }
        if (this->had_errors_ == false) {
          iVar16 = pOVar15[iVar9].field_count_;
          pFVar11 = pOVar15[iVar9].fields_;
          pFVar12 = Descriptor::field(local_128,local_11c);
          if (pFVar11 + iVar16 == pFVar12) {
            psVar13 = (string *)0x0;
          }
          else {
            psVar13 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                                (pFVar11 + iVar16,pFVar12,
                                 "out_oneof_decl.fields_ + out_oneof_decl.field_count_ == message->field(i)"
                                );
          }
          if (psVar13 != (string *)0x0) {
            CrossLinkMessage();
            if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
              operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
            }
            _Unwind_Resume(extraout_RAX);
          }
        }
        pOVar15[iVar9].field_count_ = pOVar15[iVar9].field_count_ + 1;
      }
      local_11c = local_11c + 1;
    } while (local_11c < local_128->field_count_);
  }
  if (0 < local_128->oneof_decl_count_) {
    paVar6 = &local_118->field_0;
    lVar17 = 8;
    lVar18 = 0;
    do {
      if (*(int *)((long)local_128->oneof_decls_ + lVar17 + -4) == 0) {
        local_c0.piece_._M_str = local_128->all_names_[1]._M_dataplus._M_p;
        local_c0.piece_._M_len = local_128->all_names_[1]._M_string_length;
        local_60.piece_._M_len = 1;
        local_60.piece_._M_str = ".";
        puVar3 = *(undefined8 **)(&local_128->oneof_decls_->super_SymbolBase + lVar17);
        local_88 = (pointer)*puVar3;
        local_90 = puVar3[1];
        absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_110,&local_c0,&local_60);
        uVar8 = local_110._8_8_;
        uVar7 = local_110._0_8_;
        pVVar14 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                            (&(paVar6->_impl_).oneof_decl_.super_RepeatedPtrFieldBase,(int)lVar18);
        element_name_00._M_str = (char *)uVar7;
        element_name_00._M_len = uVar8;
        AddError(this,element_name_00,&pVVar14->super_Message,NAME,
                 "Oneof must have at least one field.");
        if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
          operator_delete((void *)local_110._0_8_,local_110._16_8_ + 1);
        }
      }
      lVar18 = lVar18 + 1;
      lVar17 = lVar17 + 0x38;
    } while (lVar18 < local_128->oneof_decl_count_);
  }
  if (0 < local_128->field_count_) {
    paVar6 = &local_118->field_0;
    iVar9 = 0;
    do {
      pFVar11 = Descriptor::field(local_128,iVar9);
      bVar1 = pFVar11->field_0x1;
      if ((bVar1 & 2) != 0) {
        if ((bVar1 & 0x10) != 0) {
          if ((pFVar11->scope_).containing_oneof == (OneofDescriptor *)0x0) {
LAB_001f3f9a:
            internal::protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                       ,0xa9a);
          }
          if ((bVar1 & 0x10) != 0) {
            pDVar2 = (pFVar11->scope_).extension_scope;
            if (pDVar2 == (Descriptor *)0x0) goto LAB_001f3f9a;
            if ((pDVar2->field_count_ == 1) &&
               (((ulong)(pDVar2->merged_features_->super_Message).super_MessageLite.
                        _vptr_MessageLite & 0x200) != 0)) goto LAB_001f3ed1;
          }
        }
        pcVar4 = local_128->all_names_[1]._M_dataplus._M_p;
        sVar5 = local_128->all_names_[1]._M_string_length;
        pVVar10 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>>
                            (&(paVar6->_impl_).field_.super_RepeatedPtrFieldBase,iVar9);
        element_name_01._M_str = pcVar4;
        element_name_01._M_len = sVar5;
        AddError(this,element_name_01,&pVVar10->super_Message,OTHER,
                 "Fields with proto3_optional set must be a member of a one-field oneof");
      }
LAB_001f3ed1:
      iVar9 = iVar9 + 1;
    } while (iVar9 < local_128->field_count_);
  }
  iVar9 = local_128->oneof_decl_count_;
  if (iVar9 < 1) {
    iVar16 = -1;
  }
  else {
    local_118 = (DescriptorProto *)&(local_118->field_0)._impl_.oneof_decl_;
    iVar16 = -1;
    index = 0;
    do {
      pOVar15 = Descriptor::oneof_decl(local_128,index);
      if ((pOVar15->field_count_ == 1) && ((pOVar15->fields_->field_0x1 & 2) != 0)) {
        if (iVar16 == -1) {
          iVar16 = index;
        }
      }
      else if (iVar16 == -1) {
        iVar16 = -1;
      }
      else {
        pcVar4 = local_128->all_names_[1]._M_dataplus._M_p;
        sVar5 = local_128->all_names_[1]._M_string_length;
        pVVar14 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::internal::GenericTypeHandler<google::protobuf::OneofDescriptorProto>>
                            ((RepeatedPtrFieldBase *)local_118,index);
        element_name_02._M_str = pcVar4;
        element_name_02._M_len = sVar5;
        AddError(this,element_name_02,&pVVar14->super_Message,OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
      index = index + 1;
      iVar9 = local_128->oneof_decl_count_;
    } while (index < iVar9);
  }
  if (iVar16 != -1) {
    iVar9 = iVar16;
  }
  local_128->real_oneof_decl_count_ = iVar9;
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(
            absl::StrCat(message->full_name(), ".",
                         message->field(i - 1)->name()),
            proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE, [&] {
              return absl::Substitute(
                  "Fields in the same oneof must be defined consecutively. "
                  "\"$0\" cannot be defined before the completion of the "
                  "\"$1\" oneof definition.",
                  message->field(i - 1)->name(), oneof_decl->name());
            });
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      auto& out_oneof_decl = message->oneof_decls_[oneof_decl->index()];
      if (out_oneof_decl.field_count_ == 0) {
        out_oneof_decl.fields_ = message->field(i);
      }

      if (!had_errors_) {
        // Verify that they are contiguous.
        // This is assumed by OneofDescriptor::field(i).
        // But only if there are no errors.
        ABSL_CHECK_EQ(out_oneof_decl.fields_ + out_oneof_decl.field_count_,
                      message->field(i));
      }
      ++out_oneof_decl.field_count_;
    }
  }

  // Then verify the sizes.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(absl::StrCat(message->full_name(), ".", oneof_decl->name()),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }
  }

  for (int i = 0; i < message->field_count(); i++) {
    const FieldDescriptor* field = message->field(i);
    if (field->proto3_optional_) {
      if (!field->containing_oneof() ||
          !field->containing_oneof()->is_synthetic()) {
        AddError(message->full_name(), proto.field(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Fields with proto3_optional set must be "
                 "a member of a one-field oneof");
      }
    }
  }

  // Synthetic oneofs must be last.
  int first_synthetic = -1;
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    if (message->oneof_decl(i)->is_synthetic()) {
      if (first_synthetic == -1) {
        first_synthetic = i;
      }
    } else {
      if (first_synthetic != -1) {
        AddError(message->full_name(), proto.oneof_decl(i),
                 DescriptorPool::ErrorCollector::OTHER,
                 "Synthetic oneofs must be after all other oneofs");
      }
    }
  }

  if (first_synthetic == -1) {
    message->real_oneof_decl_count_ = message->oneof_decl_count_;
  } else {
    message->real_oneof_decl_count_ = first_synthetic;
  }
}